

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O0

stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *c,int width,int height)

{
  bool bVar1;
  stbrp__findresult sVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int waste_1;
  int y_1;
  int xpos;
  int waste;
  int y;
  stbrp_node **best;
  stbrp_node *tail;
  stbrp_node *node;
  stbrp_node **prev;
  int best_y;
  int best_x;
  int best_waste;
  stbrp__findresult fr;
  uint local_68;
  int local_64;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  stbrp_node *in_stack_ffffffffffffffb8;
  stbrp_node *first;
  stbrp_context *psVar6;
  int *local_38;
  int local_2c;
  uint local_28;
  int local_24;
  uint local_10;
  int iStack_c;
  int *local_8;
  
  local_24 = 0x40000000;
  local_2c = 0x40000000;
  local_8 = (int *)0x0;
  iVar3 = in_ESI + in_RDI[2] + -1;
  iVar3 = iVar3 - iVar3 % in_RDI[2];
  if (iVar3 % in_RDI[2] != 0) {
    __assert_fail("width % c->align == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_rectpack.h"
                  ,0x168,"stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                 );
  }
  if ((*in_RDI < iVar3) || (in_RDI[1] < in_EDX)) {
    local_8 = (int *)0x0;
    iStack_c = 0;
    local_10 = 0;
  }
  else {
    psVar6 = *(stbrp_context **)(in_RDI + 6);
    local_38 = in_RDI + 6;
    while ((int)((uint)(ushort)psVar6->width + iVar3) <= *in_RDI) {
      in_stack_ffffffffffffffac =
           stbrp__skyline_find_min_y
                     (psVar6,in_stack_ffffffffffffffb8,(int)((ulong)local_8 >> 0x20),(int)local_8,
                      (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (in_RDI[4] == 0) {
        if (in_stack_ffffffffffffffac < local_2c) {
          local_8 = local_38;
          local_2c = in_stack_ffffffffffffffac;
        }
      }
      else if ((in_stack_ffffffffffffffac + in_EDX <= in_RDI[1]) &&
              ((in_stack_ffffffffffffffac < local_2c ||
               ((in_stack_ffffffffffffffac == local_2c && (in_stack_ffffffffffffffa8 < local_24)))))
              ) {
        local_8 = local_38;
        local_2c = in_stack_ffffffffffffffac;
        local_24 = in_stack_ffffffffffffffa8;
      }
      local_38 = &psVar6->align;
      psVar6 = *(stbrp_context **)&psVar6->align;
    }
    if (local_8 == (int *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = (uint)(*(stbrp_node **)local_8)->x;
    }
    local_28 = local_68;
    if (in_RDI[4] == 1) {
      psVar6 = *(stbrp_context **)(in_RDI + 6);
      local_38 = in_RDI + 6;
      for (first = *(stbrp_node **)(in_RDI + 6); (int)(uint)first->x < iVar3; first = first->next) {
      }
      for (; first != (stbrp_node *)0x0; first = first->next) {
        uVar4 = (uint)first->x - iVar3;
        if ((int)uVar4 < 0) {
          __assert_fail("xpos >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_rectpack.h"
                        ,0x1a8,
                        "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)")
          ;
        }
        while ((int)(uint)**(ushort **)&psVar6->align <= (int)uVar4) {
          local_38 = &psVar6->align;
          psVar6 = *(stbrp_context **)&psVar6->align;
        }
        bVar1 = false;
        if ((int)uVar4 < (int)(uint)**(ushort **)&psVar6->align) {
          bVar1 = (int)(uint)(ushort)psVar6->width <= (int)uVar4;
        }
        if (!bVar1) {
          __assert_fail("node->next->x > xpos && node->x <= xpos",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_rectpack.h"
                        ,0x1ae,
                        "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)")
          ;
        }
        iVar5 = stbrp__skyline_find_min_y
                          (psVar6,first,(int)((ulong)local_8 >> 0x20),(int)local_8,
                           (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        if (((iVar5 + in_EDX <= in_RDI[1]) && (iVar5 <= local_2c)) &&
           (((iVar5 < local_2c || (local_64 < local_24)) ||
            ((local_64 == local_24 && ((int)uVar4 < (int)local_28)))))) {
          if (local_2c < iVar5) {
            __assert_fail("y <= best_y",
                          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_rectpack.h"
                          ,0x1b4,
                          "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                         );
          }
          local_24 = local_64;
          local_8 = local_38;
          local_2c = iVar5;
          local_28 = uVar4;
        }
      }
    }
    local_10 = local_28;
    iStack_c = local_2c;
  }
  sVar2.y = iStack_c;
  sVar2.x = local_10;
  sVar2.prev_link = (stbrp_node **)local_8;
  return sVar2;
}

Assistant:

static stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *c, int width, int height)
{
   int best_waste = (1<<30), best_x, best_y = (1 << 30);
   stbrp__findresult fr;
   stbrp_node **prev, *node, *tail, **best = NULL;

   // align to multiple of c->align
   width = (width + c->align - 1);
   width -= width % c->align;
   STBRP_ASSERT(width % c->align == 0);

   // if it can't possibly fit, bail immediately
   if (width > c->width || height > c->height) {
      fr.prev_link = NULL;
      fr.x = fr.y = 0;
      return fr;
   }

   node = c->active_head;
   prev = &c->active_head;
   while (node->x + width <= c->width) {
      int y,waste;
      y = stbrp__skyline_find_min_y(c, node, node->x, width, &waste);
      if (c->heuristic == STBRP_HEURISTIC_Skyline_BL_sortHeight) { // actually just want to test BL
         // bottom left
         if (y < best_y) {
            best_y = y;
            best = prev;
         }
      } else {
         // best-fit
         if (y + height <= c->height) {
            // can only use it if it first vertically
            if (y < best_y || (y == best_y && waste < best_waste)) {
               best_y = y;
               best_waste = waste;
               best = prev;
            }
         }
      }
      prev = &node->next;
      node = node->next;
   }

   best_x = (best == NULL) ? 0 : (*best)->x;

   // if doing best-fit (BF), we also have to try aligning right edge to each node position
   //
   // e.g, if fitting
   //
   //     ____________________
   //    |____________________|
   //
   //            into
   //
   //   |                         |
   //   |             ____________|
   //   |____________|
   //
   // then right-aligned reduces waste, but bottom-left BL is always chooses left-aligned
   //
   // This makes BF take about 2x the time

   if (c->heuristic == STBRP_HEURISTIC_Skyline_BF_sortHeight) {
      tail = c->active_head;
      node = c->active_head;
      prev = &c->active_head;
      // find first node that's admissible
      while (tail->x < width)
         tail = tail->next;
      while (tail) {
         int xpos = tail->x - width;
         int y,waste;
         STBRP_ASSERT(xpos >= 0);
         // find the left position that matches this
         while (node->next->x <= xpos) {
            prev = &node->next;
            node = node->next;
         }
         STBRP_ASSERT(node->next->x > xpos && node->x <= xpos);
         y = stbrp__skyline_find_min_y(c, node, xpos, width, &waste);
         if (y + height <= c->height) {
            if (y <= best_y) {
               if (y < best_y || waste < best_waste || (waste==best_waste && xpos < best_x)) {
                  best_x = xpos;
                  STBRP_ASSERT(y <= best_y);
                  best_y = y;
                  best_waste = waste;
                  best = prev;
               }
            }
         }
         tail = tail->next;
      }         
   }

   fr.prev_link = best;
   fr.x = best_x;
   fr.y = best_y;
   return fr;
}